

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O2

void __thiscall xLearn::Score::~Score(Score *this)

{
  this->_vptr_Score = (_func_int **)&PTR__Score_0014a3d8;
  std::__cxx11::string::~string((string *)&this->opt_type_);
  return;
}

Assistant:

virtual ~Score() { }